

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureAlloc.cpp
# Opt level: O0

void __thiscall GmmLib::GmmTextureCalc::SetTileMode(GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  SKU_FEATURE_TABLE *pSVar1;
  GMM_TILE_MODE local_1c8;
  GMM_TILE_MODE local_1c4;
  GMM_TILE_MODE local_1c0;
  GMM_TILE_MODE local_1bc;
  GMM_TILE_MODE local_1b8;
  GMM_TILE_MODE local_1b4;
  GMM_TILE_MODE local_1b0;
  GMM_TILE_MODE local_1ac;
  GMM_TILE_MODE local_1a8;
  GMM_TILE_MODE local_1a4;
  GMM_TILE_MODE local_1a0;
  GMM_TILE_MODE local_19c;
  GMM_TILE_MODE local_198;
  GMM_TILE_MODE local_194;
  GMM_TILE_MODE local_190;
  GMM_TILE_MODE local_18c;
  GMM_TILE_MODE local_188;
  GMM_TILE_MODE local_184;
  GMM_TILE_MODE local_174;
  GMM_TILE_MODE local_170;
  GMM_TILE_MODE local_16c;
  GMM_TILE_MODE local_160;
  GMM_TILE_MODE local_15c;
  GMM_TILE_MODE local_158;
  GMM_TILE_MODE local_154;
  GMM_TILE_MODE local_150;
  GMM_TILE_MODE local_14c;
  GMM_TILE_MODE local_148;
  GMM_TILE_MODE local_144;
  GMM_TILE_MODE local_140;
  GMM_TILE_MODE local_13c;
  GMM_TILE_MODE local_138;
  GMM_TILE_MODE local_134;
  GMM_TILE_MODE local_130;
  GMM_TILE_MODE local_12c;
  GMM_TILE_MODE local_128;
  GMM_TILE_MODE local_124;
  GMM_TILE_MODE local_120;
  GMM_TILE_MODE local_11c;
  GMM_TILE_MODE local_10c;
  GMM_TILE_MODE local_108;
  GMM_TILE_MODE local_104;
  GMM_TILE_MODE local_f8;
  GMM_TILE_MODE local_f4;
  GMM_TILE_MODE local_f0;
  GMM_TILE_MODE local_ec;
  GMM_TILE_MODE local_e8;
  GMM_TILE_MODE local_e4;
  GMM_TILE_MODE local_e0;
  GMM_TILE_MODE local_dc;
  GMM_TILE_MODE local_d8;
  GMM_TILE_MODE local_d4;
  GMM_TILE_MODE local_d0;
  GMM_TILE_MODE local_cc;
  GMM_TILE_MODE local_c8;
  GMM_TILE_MODE local_c4;
  GMM_TILE_MODE local_c0;
  GMM_TILE_MODE local_bc;
  GMM_TILE_MODE local_b8;
  GMM_TILE_MODE local_b4;
  GMM_TILE_MODE local_a4;
  GMM_TILE_MODE local_a0;
  GMM_TILE_MODE local_9c;
  GMM_TILE_MODE local_90;
  GMM_TILE_MODE local_8c;
  GMM_TILE_MODE local_88;
  GMM_TILE_MODE local_84;
  GMM_TILE_MODE local_80;
  GMM_TILE_MODE local_7c;
  GMM_TILE_MODE local_78;
  GMM_TILE_MODE local_74;
  GMM_TILE_MODE local_70;
  GMM_TILE_MODE local_6c;
  GMM_TILE_MODE local_68;
  GMM_TILE_MODE local_64;
  GMM_TILE_MODE local_60;
  GMM_TILE_MODE local_5c;
  GMM_TILE_MODE local_58;
  GMM_TILE_MODE local_54;
  GMM_TILE_MODE local_50;
  GMM_TILE_MODE local_4c;
  GMM_TILE_MODE local_3c;
  GMM_TILE_MODE local_38;
  GMM_TILE_MODE local_34;
  GMM_PLATFORM_INFO *pPlatform;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  GmmGetPlatformInfo(this->pGmmLibContext);
  pTexInfo->TileMode = TILE_NONE;
  if (((((ulong)(pTexInfo->Flags).Info >> 0x25 & 1) == 0) &&
      (((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0)) &&
     (((ulong)(pTexInfo->Flags).Info >> 0x2c & 1) == 0)) {
    if ((((ulong)(pTexInfo->Flags).Info >> 0x24 & 1) == 0) &&
       (((ulong)(pTexInfo->Flags).Info >> 0x2b & 1) == 0)) {
      if (((ulong)(pTexInfo->Flags).Info >> 0x23 & 1) == 0) {
        if (((ulong)(pTexInfo->Flags).Info >> 0x22 & 1) == 0) {
          if (((ulong)(pTexInfo->Flags).Info >> 0x13 & 1) != 0) {
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xffffffefffffffff);
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xffffffdfffffffff);
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xffffffbfffffffff);
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xfffffff7ffffffff);
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xfffffffbffffffff);
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xfffffffffff7ffff | 0x80000);
            pTexInfo->TileMode = TILE_NONE;
          }
        }
        else {
          (pTexInfo->Flags).Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(pTexInfo->Flags).Info & 0xffffffefffffffff);
          (pTexInfo->Flags).Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(pTexInfo->Flags).Info & 0xffffffdfffffffff);
          (pTexInfo->Flags).Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(pTexInfo->Flags).Info & 0xffffffbfffffffff);
          (pTexInfo->Flags).Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(pTexInfo->Flags).Info & 0xfffffff7ffffffff);
          (pTexInfo->Flags).Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(pTexInfo->Flags).Info & 0xfffffffbffffffff | 0x400000000);
          (pTexInfo->Flags).Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(pTexInfo->Flags).Info & 0xfffffffffff7ffff);
          pTexInfo->TileMode = LEGACY_TILE_Y;
        }
      }
      else {
        (pTexInfo->Flags).Info =
             (anon_struct_8_44_94931171_for_Info)
             ((ulong)(pTexInfo->Flags).Info & 0xffffffefffffffff);
        (pTexInfo->Flags).Info =
             (anon_struct_8_44_94931171_for_Info)
             ((ulong)(pTexInfo->Flags).Info & 0xffffffdfffffffff);
        (pTexInfo->Flags).Info =
             (anon_struct_8_44_94931171_for_Info)
             ((ulong)(pTexInfo->Flags).Info & 0xffffffbfffffffff);
        (pTexInfo->Flags).Info =
             (anon_struct_8_44_94931171_for_Info)
             ((ulong)(pTexInfo->Flags).Info & 0xfffffff7ffffffff | 0x800000000);
        (pTexInfo->Flags).Info =
             (anon_struct_8_44_94931171_for_Info)
             ((ulong)(pTexInfo->Flags).Info & 0xfffffffbffffffff);
        (pTexInfo->Flags).Info =
             (anon_struct_8_44_94931171_for_Info)
             ((ulong)(pTexInfo->Flags).Info & 0xfffffffffff7ffff);
        pTexInfo->TileMode = LEGACY_TILE_X;
      }
    }
    else {
      pSVar1 = Context::GetSkuTable(this->pGmmLibContext);
      if ((*(ushort *)&pSVar1->field_0 >> 6 & 1) == 0) {
        (pTexInfo->Flags).Info =
             (anon_struct_8_44_94931171_for_Info)
             ((ulong)(pTexInfo->Flags).Info & 0xfffff7ffffffffff | 0x80000000000);
      }
      else {
        (pTexInfo->Flags).Info =
             (anon_struct_8_44_94931171_for_Info)
             ((ulong)(pTexInfo->Flags).Info & 0xffffffefffffffff | 0x1000000000);
      }
      (pTexInfo->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)((ulong)(pTexInfo->Flags).Info & 0xffffffdfffffffff);
      (pTexInfo->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)((ulong)(pTexInfo->Flags).Info & 0xffffffbfffffffff);
      (pTexInfo->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)((ulong)(pTexInfo->Flags).Info & 0xfffffff7ffffffff);
      (pTexInfo->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)((ulong)(pTexInfo->Flags).Info & 0xfffffffbffffffff);
      (pTexInfo->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)((ulong)(pTexInfo->Flags).Info & 0xfffffffffff7ffff);
      pSVar1 = Context::GetSkuTable(this->pGmmLibContext);
      if ((*(ushort *)&pSVar1->field_0 >> 6 & 1) == 0) {
        pTexInfo->TileMode = TILE4;
      }
      else {
        pTexInfo->TileMode = LEGACY_TILE_Y;
      }
    }
  }
  else {
    if (((ulong)(pTexInfo->Flags).Info >> 0x25 & 1) == 0) {
      pSVar1 = Context::GetSkuTable(this->pGmmLibContext);
      if ((*(ushort *)&pSVar1->field_0 >> 6 & 1) == 0) {
        pSVar1 = Context::GetSkuTable(this->pGmmLibContext);
        if (((ulong)pSVar1->field_1 >> 0x23 & 1) == 0) {
          switch(pTexInfo->Type) {
          case RESOURCE_1D:
            if (pTexInfo->BitsPerPixel == 0x80) {
              local_16c = TILE__64_1D_128bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x40) {
                local_170 = TILE__64_1D_64bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x20) {
                  local_174 = TILE__64_1D_32bpe;
                }
                else {
                  local_174 = TILE__64_1D_8bpe;
                  if (pTexInfo->BitsPerPixel == 0x10) {
                    local_174 = TILE__64_1D_16bpe;
                  }
                }
                local_170 = local_174;
              }
              local_16c = local_170;
            }
            pTexInfo->TileMode = local_16c;
            break;
          case RESOURCE_2D:
          case RESOURCE_CUBE:
            switch((pTexInfo->MSAA).NumSamples) {
            case 1:
              if (pTexInfo->BitsPerPixel == 0x80) {
                local_184 = TILE__64_2D_128bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x40) {
                  local_188 = TILE__64_2D_64bpe;
                }
                else {
                  if (pTexInfo->BitsPerPixel == 0x20) {
                    local_18c = TILE__64_2D_32bpe;
                  }
                  else {
                    local_18c = TILE__64_2D_8bpe;
                    if (pTexInfo->BitsPerPixel == 0x10) {
                      local_18c = TILE__64_2D_16bpe;
                    }
                  }
                  local_188 = local_18c;
                }
                local_184 = local_188;
              }
              pTexInfo->TileMode = local_184;
              break;
            case 2:
              if (pTexInfo->BitsPerPixel == 0x80) {
                local_190 = TILE__64_2D_2X_128bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x40) {
                  local_194 = TILE__64_2D_2X_64bpe;
                }
                else {
                  if (pTexInfo->BitsPerPixel == 0x20) {
                    local_198 = TILE__64_2D_2X_32bpe;
                  }
                  else {
                    local_198 = TILE__64_2D_2X_8bpe;
                    if (pTexInfo->BitsPerPixel == 0x10) {
                      local_198 = TILE__64_2D_2X_16bpe;
                    }
                  }
                  local_194 = local_198;
                }
                local_190 = local_194;
              }
              pTexInfo->TileMode = local_190;
              break;
            default:
              break;
            case 4:
              if (pTexInfo->BitsPerPixel == 0x80) {
                local_19c = TILE__64_2D_4X_128bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x40) {
                  local_1a0 = TILE__64_2D_4X_64bpe;
                }
                else {
                  if (pTexInfo->BitsPerPixel == 0x20) {
                    local_1a4 = TILE__64_2D_4X_32bpe;
                  }
                  else {
                    local_1a4 = TILE__64_2D_4X_8bpe;
                    if (pTexInfo->BitsPerPixel == 0x10) {
                      local_1a4 = TILE__64_2D_4X_16bpe;
                    }
                  }
                  local_1a0 = local_1a4;
                }
                local_19c = local_1a0;
              }
              pTexInfo->TileMode = local_19c;
              break;
            case 8:
              if (pTexInfo->BitsPerPixel == 0x80) {
                local_1a8 = TILE__64_2D_4X_128bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x40) {
                  local_1ac = TILE__64_2D_4X_64bpe;
                }
                else {
                  if (pTexInfo->BitsPerPixel == 0x20) {
                    local_1b0 = TILE__64_2D_4X_32bpe;
                  }
                  else {
                    local_1b0 = TILE__64_2D_4X_8bpe;
                    if (pTexInfo->BitsPerPixel == 0x10) {
                      local_1b0 = TILE__64_2D_4X_16bpe;
                    }
                  }
                  local_1ac = local_1b0;
                }
                local_1a8 = local_1ac;
              }
              pTexInfo->TileMode = local_1a8;
              break;
            case 0x10:
              if (pTexInfo->BitsPerPixel == 0x80) {
                local_1b4 = TILE__64_2D_4X_128bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x40) {
                  local_1b8 = TILE__64_2D_4X_64bpe;
                }
                else {
                  if (pTexInfo->BitsPerPixel == 0x20) {
                    local_1bc = TILE__64_2D_4X_32bpe;
                  }
                  else {
                    local_1bc = TILE__64_2D_4X_8bpe;
                    if (pTexInfo->BitsPerPixel == 0x10) {
                      local_1bc = TILE__64_2D_4X_16bpe;
                    }
                  }
                  local_1b8 = local_1bc;
                }
                local_1b4 = local_1b8;
              }
              pTexInfo->TileMode = local_1b4;
            }
            break;
          case RESOURCE_3D:
            if (pTexInfo->BitsPerPixel == 0x80) {
              local_1c0 = TILE__64_3D_128bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x40) {
                local_1c4 = TILE__64_3D_64bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x20) {
                  local_1c8 = TILE__64_3D_32bpe;
                }
                else {
                  local_1c8 = TILE__64_3D_8bpe;
                  if (pTexInfo->BitsPerPixel == 0x10) {
                    local_1c8 = TILE__64_3D_16bpe;
                  }
                }
                local_1c4 = local_1c8;
              }
              local_1c0 = local_1c4;
            }
            pTexInfo->TileMode = local_1c0;
          }
        }
        else {
          switch(pTexInfo->Type) {
          case RESOURCE_1D:
            if (pTexInfo->BitsPerPixel == 0x80) {
              local_104 = TILE__64_1D_128bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x40) {
                local_108 = TILE__64_1D_64bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x20) {
                  local_10c = TILE__64_1D_32bpe;
                }
                else {
                  local_10c = TILE__64_1D_8bpe;
                  if (pTexInfo->BitsPerPixel == 0x10) {
                    local_10c = TILE__64_1D_16bpe;
                  }
                }
                local_108 = local_10c;
              }
              local_104 = local_108;
            }
            pTexInfo->TileMode = local_104;
            break;
          case RESOURCE_2D:
          case RESOURCE_CUBE:
            switch((pTexInfo->MSAA).NumSamples) {
            case 1:
              if (pTexInfo->BitsPerPixel == 0x80) {
                local_11c = TILE__64_2D_128bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x40) {
                  local_120 = TILE__64_2D_64bpe;
                }
                else {
                  if (pTexInfo->BitsPerPixel == 0x20) {
                    local_124 = TILE__64_2D_32bpe;
                  }
                  else {
                    local_124 = TILE__64_2D_8bpe;
                    if (pTexInfo->BitsPerPixel == 0x10) {
                      local_124 = TILE__64_2D_16bpe;
                    }
                  }
                  local_120 = local_124;
                }
                local_11c = local_120;
              }
              pTexInfo->TileMode = local_11c;
              break;
            case 2:
              if (pTexInfo->BitsPerPixel == 0x80) {
                local_128 = TILE__64_2D_2X_128bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x40) {
                  local_12c = TILE__64_2D_2X_64bpe;
                }
                else {
                  if (pTexInfo->BitsPerPixel == 0x20) {
                    local_130 = TILE__64_2D_2X_32bpe;
                  }
                  else {
                    local_130 = TILE__64_2D_2X_8bpe;
                    if (pTexInfo->BitsPerPixel == 0x10) {
                      local_130 = TILE__64_2D_2X_16bpe;
                    }
                  }
                  local_12c = local_130;
                }
                local_128 = local_12c;
              }
              pTexInfo->TileMode = local_128;
              break;
            default:
              break;
            case 4:
              if (pTexInfo->BitsPerPixel == 0x80) {
                local_134 = TILE__64_2D_4X_128bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x40) {
                  local_138 = TILE__64_2D_4X_64bpe;
                }
                else {
                  if (pTexInfo->BitsPerPixel == 0x20) {
                    local_13c = TILE__64_2D_4X_32bpe;
                  }
                  else {
                    local_13c = TILE__64_2D_4X_8bpe;
                    if (pTexInfo->BitsPerPixel == 0x10) {
                      local_13c = TILE__64_2D_4X_16bpe;
                    }
                  }
                  local_138 = local_13c;
                }
                local_134 = local_138;
              }
              pTexInfo->TileMode = local_134;
              break;
            case 8:
              if (pTexInfo->BitsPerPixel == 0x80) {
                local_140 = TILE__64_2D_8X_128bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x40) {
                  local_144 = TILE__64_2D_8X_64bpe;
                }
                else {
                  if (pTexInfo->BitsPerPixel == 0x20) {
                    local_148 = TILE__64_2D_8X_32bpe;
                  }
                  else {
                    local_148 = TILE__64_2D_8X_8bpe;
                    if (pTexInfo->BitsPerPixel == 0x10) {
                      local_148 = TILE__64_2D_8X_16bpe;
                    }
                  }
                  local_144 = local_148;
                }
                local_140 = local_144;
              }
              pTexInfo->TileMode = local_140;
              break;
            case 0x10:
              if (pTexInfo->BitsPerPixel == 0x80) {
                local_14c = TILE__64_2D_16X_128bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x40) {
                  local_150 = TILE__64_2D_16X_64bpe;
                }
                else {
                  if (pTexInfo->BitsPerPixel == 0x20) {
                    local_154 = TILE__64_2D_16X_32bpe;
                  }
                  else {
                    local_154 = TILE__64_2D_16X_8bpe;
                    if (pTexInfo->BitsPerPixel == 0x10) {
                      local_154 = TILE__64_2D_16X_16bpe;
                    }
                  }
                  local_150 = local_154;
                }
                local_14c = local_150;
              }
              pTexInfo->TileMode = local_14c;
            }
            break;
          case RESOURCE_3D:
            if (pTexInfo->BitsPerPixel == 0x80) {
              local_158 = TILE__64_3D_128bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x40) {
                local_15c = TILE__64_3D_64bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x20) {
                  local_160 = TILE__64_3D_32bpe;
                }
                else {
                  local_160 = TILE__64_3D_8bpe;
                  if (pTexInfo->BitsPerPixel == 0x10) {
                    local_160 = TILE__64_3D_16bpe;
                  }
                }
                local_15c = local_160;
              }
              local_158 = local_15c;
            }
            pTexInfo->TileMode = local_158;
          }
        }
      }
      else {
        switch(pTexInfo->Type) {
        case RESOURCE_1D:
          if (pTexInfo->BitsPerPixel == 0x80) {
            local_9c = TILE_YS_1D_128bpe;
          }
          else {
            if (pTexInfo->BitsPerPixel == 0x40) {
              local_a0 = TILE_YS_1D_64bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x20) {
                local_a4 = TILE_YS_1D_32bpe;
              }
              else {
                local_a4 = TILE_YS_1D_8bpe;
                if (pTexInfo->BitsPerPixel == 0x10) {
                  local_a4 = TILE_YS_1D_16bpe;
                }
              }
              local_a0 = local_a4;
            }
            local_9c = local_a0;
          }
          pTexInfo->TileMode = local_9c;
          break;
        case RESOURCE_2D:
        case RESOURCE_CUBE:
          switch((pTexInfo->MSAA).NumSamples) {
          case 1:
            if (pTexInfo->BitsPerPixel == 0x80) {
              local_b4 = TILE_YS_2D_128bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x40) {
                local_b8 = TILE_YS_2D_64bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x20) {
                  local_bc = TILE_YS_2D_32bpe;
                }
                else {
                  local_bc = TILE_YS_2D_8bpe;
                  if (pTexInfo->BitsPerPixel == 0x10) {
                    local_bc = TILE_YS_2D_16bpe;
                  }
                }
                local_b8 = local_bc;
              }
              local_b4 = local_b8;
            }
            pTexInfo->TileMode = local_b4;
            break;
          case 2:
            if (pTexInfo->BitsPerPixel == 0x80) {
              local_c0 = TILE_YS_2D_2X_128bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x40) {
                local_c4 = TILE_YS_2D_2X_64bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x20) {
                  local_c8 = TILE_YS_2D_2X_32bpe;
                }
                else {
                  local_c8 = TILE_YS_2D_2X_8bpe;
                  if (pTexInfo->BitsPerPixel == 0x10) {
                    local_c8 = TILE_YS_2D_2X_16bpe;
                  }
                }
                local_c4 = local_c8;
              }
              local_c0 = local_c4;
            }
            pTexInfo->TileMode = local_c0;
            break;
          default:
            break;
          case 4:
            if (pTexInfo->BitsPerPixel == 0x80) {
              local_cc = TILE_YS_2D_4X_128bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x40) {
                local_d0 = TILE_YS_2D_4X_64bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x20) {
                  local_d4 = TILE_YS_2D_4X_32bpe;
                }
                else {
                  local_d4 = TILE_YS_2D_4X_8bpe;
                  if (pTexInfo->BitsPerPixel == 0x10) {
                    local_d4 = TILE_YS_2D_4X_16bpe;
                  }
                }
                local_d0 = local_d4;
              }
              local_cc = local_d0;
            }
            pTexInfo->TileMode = local_cc;
            break;
          case 8:
            if (pTexInfo->BitsPerPixel == 0x80) {
              local_d8 = TILE_YS_2D_8X_128bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x40) {
                local_dc = TILE_YS_2D_8X_64bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x20) {
                  local_e0 = TILE_YS_2D_8X_32bpe;
                }
                else {
                  local_e0 = TILE_YS_2D_8X_8bpe;
                  if (pTexInfo->BitsPerPixel == 0x10) {
                    local_e0 = TILE_YS_2D_8X_16bpe;
                  }
                }
                local_dc = local_e0;
              }
              local_d8 = local_dc;
            }
            pTexInfo->TileMode = local_d8;
            break;
          case 0x10:
            if (pTexInfo->BitsPerPixel == 0x80) {
              local_e4 = TILE_YS_2D_16X_128bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x40) {
                local_e8 = TILE_YS_2D_16X_64bpe;
              }
              else {
                if (pTexInfo->BitsPerPixel == 0x20) {
                  local_ec = TILE_YS_2D_16X_32bpe;
                }
                else {
                  local_ec = TILE_YS_2D_16X_8bpe;
                  if (pTexInfo->BitsPerPixel == 0x10) {
                    local_ec = TILE_YS_2D_16X_16bpe;
                  }
                }
                local_e8 = local_ec;
              }
              local_e4 = local_e8;
            }
            pTexInfo->TileMode = local_e4;
          }
          break;
        case RESOURCE_3D:
          if (pTexInfo->BitsPerPixel == 0x80) {
            local_f0 = TILE_YS_3D_128bpe;
          }
          else {
            if (pTexInfo->BitsPerPixel == 0x40) {
              local_f4 = TILE_YS_3D_64bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x20) {
                local_f8 = TILE_YS_3D_32bpe;
              }
              else {
                local_f8 = TILE_YS_3D_8bpe;
                if (pTexInfo->BitsPerPixel == 0x10) {
                  local_f8 = TILE_YS_3D_16bpe;
                }
              }
              local_f4 = local_f8;
            }
            local_f0 = local_f4;
          }
          pTexInfo->TileMode = local_f0;
        }
      }
      (pTexInfo->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)((ulong)(pTexInfo->Flags).Info & 0xffffffdfffffffff);
      pSVar1 = Context::GetSkuTable(this->pGmmLibContext);
      if ((*(ushort *)&pSVar1->field_0 >> 6 & 1) == 0) {
        (pTexInfo->Flags).Info =
             (anon_struct_8_44_94931171_for_Info)
             ((ulong)(pTexInfo->Flags).Info & 0xffffefffffffffff | 0x100000000000);
      }
      else {
        (pTexInfo->Flags).Info =
             (anon_struct_8_44_94931171_for_Info)
             ((ulong)(pTexInfo->Flags).Info & 0xffffffbfffffffff | 0x4000000000);
      }
    }
    else {
      switch(pTexInfo->Type) {
      case RESOURCE_1D:
        if (pTexInfo->BitsPerPixel == 0x80) {
          local_34 = TILE_YF_1D_128bpe;
        }
        else {
          if (pTexInfo->BitsPerPixel == 0x40) {
            local_38 = TILE_YF_1D_64bpe;
          }
          else {
            if (pTexInfo->BitsPerPixel == 0x20) {
              local_3c = TILE_YF_1D_32bpe;
            }
            else {
              local_3c = TILE_YF_1D_8bpe;
              if (pTexInfo->BitsPerPixel == 0x10) {
                local_3c = TILE_YF_1D_16bpe;
              }
            }
            local_38 = local_3c;
          }
          local_34 = local_38;
        }
        pTexInfo->TileMode = local_34;
        break;
      case RESOURCE_2D:
      case RESOURCE_CUBE:
        switch((pTexInfo->MSAA).NumSamples) {
        case 1:
          if (pTexInfo->BitsPerPixel == 0x80) {
            local_4c = TILE_YF_2D_128bpe;
          }
          else {
            if (pTexInfo->BitsPerPixel == 0x40) {
              local_50 = TILE_YF_2D_64bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x20) {
                local_54 = TILE_YF_2D_32bpe;
              }
              else {
                local_54 = TILE_YF_2D_8bpe;
                if (pTexInfo->BitsPerPixel == 0x10) {
                  local_54 = TILE_YF_2D_16bpe;
                }
              }
              local_50 = local_54;
            }
            local_4c = local_50;
          }
          pTexInfo->TileMode = local_4c;
          break;
        case 2:
          if (pTexInfo->BitsPerPixel == 0x80) {
            local_58 = TILE_YF_2D_2X_128bpe;
          }
          else {
            if (pTexInfo->BitsPerPixel == 0x40) {
              local_5c = TILE_YF_2D_2X_64bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x20) {
                local_60 = TILE_YF_2D_2X_32bpe;
              }
              else {
                local_60 = TILE_YF_2D_2X_8bpe;
                if (pTexInfo->BitsPerPixel == 0x10) {
                  local_60 = TILE_YF_2D_2X_16bpe;
                }
              }
              local_5c = local_60;
            }
            local_58 = local_5c;
          }
          pTexInfo->TileMode = local_58;
          break;
        default:
          break;
        case 4:
          if (pTexInfo->BitsPerPixel == 0x80) {
            local_64 = TILE_YF_2D_4X_128bpe;
          }
          else {
            if (pTexInfo->BitsPerPixel == 0x40) {
              local_68 = TILE_YF_2D_4X_64bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x20) {
                local_6c = TILE_YF_2D_4X_32bpe;
              }
              else {
                local_6c = TILE_YF_2D_4X_8bpe;
                if (pTexInfo->BitsPerPixel == 0x10) {
                  local_6c = TILE_YF_2D_4X_16bpe;
                }
              }
              local_68 = local_6c;
            }
            local_64 = local_68;
          }
          pTexInfo->TileMode = local_64;
          break;
        case 8:
          if (pTexInfo->BitsPerPixel == 0x80) {
            local_70 = TILE_YF_2D_8X_128bpe;
          }
          else {
            if (pTexInfo->BitsPerPixel == 0x40) {
              local_74 = TILE_YF_2D_8X_64bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x20) {
                local_78 = TILE_YF_2D_8X_32bpe;
              }
              else {
                local_78 = TILE_YF_2D_8X_8bpe;
                if (pTexInfo->BitsPerPixel == 0x10) {
                  local_78 = TILE_YF_2D_8X_16bpe;
                }
              }
              local_74 = local_78;
            }
            local_70 = local_74;
          }
          pTexInfo->TileMode = local_70;
          break;
        case 0x10:
          if (pTexInfo->BitsPerPixel == 0x80) {
            local_7c = TILE_YF_2D_16X_128bpe;
          }
          else {
            if (pTexInfo->BitsPerPixel == 0x40) {
              local_80 = TILE_YF_2D_16X_64bpe;
            }
            else {
              if (pTexInfo->BitsPerPixel == 0x20) {
                local_84 = TILE_YF_2D_16X_32bpe;
              }
              else {
                local_84 = TILE_YF_2D_16X_8bpe;
                if (pTexInfo->BitsPerPixel == 0x10) {
                  local_84 = TILE_YF_2D_16X_16bpe;
                }
              }
              local_80 = local_84;
            }
            local_7c = local_80;
          }
          pTexInfo->TileMode = local_7c;
        }
        break;
      case RESOURCE_3D:
        if (pTexInfo->BitsPerPixel == 0x80) {
          local_88 = TILE_YF_3D_128bpe;
        }
        else {
          if (pTexInfo->BitsPerPixel == 0x40) {
            local_8c = TILE_YF_3D_64bpe;
          }
          else {
            if (pTexInfo->BitsPerPixel == 0x20) {
              local_90 = TILE_YF_3D_32bpe;
            }
            else {
              local_90 = TILE_YF_3D_8bpe;
              if (pTexInfo->BitsPerPixel == 0x10) {
                local_90 = TILE_YF_3D_16bpe;
              }
            }
            local_8c = local_90;
          }
          local_88 = local_8c;
        }
        pTexInfo->TileMode = local_88;
      }
      (pTexInfo->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)
           ((ulong)(pTexInfo->Flags).Info & 0xffffffdfffffffff | 0x2000000000);
      (pTexInfo->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)((ulong)(pTexInfo->Flags).Info & 0xffffffbfffffffff);
    }
    pSVar1 = Context::GetSkuTable(this->pGmmLibContext);
    if ((*(ushort *)&pSVar1->field_0 >> 6 & 1) == 0) {
      pSVar1 = Context::GetSkuTable(this->pGmmLibContext);
      (pTexInfo->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)
           ((ulong)(pTexInfo->Flags).Info & 0xfffff7ffffffffff |
           (ulong)((*(ushort *)&pSVar1->field_0 >> 6 & 1) != 0) << 0x2b);
    }
    else {
      pSVar1 = Context::GetSkuTable(this->pGmmLibContext);
      (pTexInfo->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)
           ((ulong)(pTexInfo->Flags).Info & 0xffffffefffffffff |
           (ulong)((*(ushort *)&pSVar1->field_0 >> 6 & 1) != 0) << 0x24);
    }
    (pTexInfo->Flags).Info =
         (anon_struct_8_44_94931171_for_Info)((ulong)(pTexInfo->Flags).Info & 0xfffffff7ffffffff);
    (pTexInfo->Flags).Info =
         (anon_struct_8_44_94931171_for_Info)((ulong)(pTexInfo->Flags).Info & 0xfffffffbffffffff);
    (pTexInfo->Flags).Info =
         (anon_struct_8_44_94931171_for_Info)((ulong)(pTexInfo->Flags).Info & 0xfffffffffff7ffff);
  }
  return;
}

Assistant:

void GmmLib::GmmTextureCalc::SetTileMode(GMM_TEXTURE_INFO *pTexInfo)
{
    const GMM_PLATFORM_INFO *pPlatform;

    pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);
    
    pTexInfo->TileMode = TILE_NONE;

    if(pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags))
    {
// clang-format off
        #define SET_TILE_MODE(Tile, Submode)                                                \
        {                                                                                   \
                pTexInfo->TileMode =                                                        \
                    (pTexInfo->BitsPerPixel == 128) ? TILE_##Tile##_##Submode##_128bpe :    \
                    (pTexInfo->BitsPerPixel ==  64) ? TILE_##Tile##_##Submode##_64bpe  :    \
                    (pTexInfo->BitsPerPixel ==  32) ? TILE_##Tile##_##Submode##_32bpe  :    \
                    (pTexInfo->BitsPerPixel ==  16) ? TILE_##Tile##_##Submode##_16bpe  :    \
                                                      TILE_##Tile##_##Submode##_8bpe;       \
        }                                                                                   \

        #define GENERATE_TILE_MODE(T, M1d, M2d, M2d_2x, M2d_4x, M2d_8x, M2d_16x, M3d)            \
        {\
            switch (pTexInfo->Type)\
            {\
                case RESOURCE_1D:\
                    SET_TILE_MODE(T, M1d);\
                    break;\
                case RESOURCE_2D:\
                case RESOURCE_CUBE:\
                    switch (pTexInfo->MSAA.NumSamples)\
                    {\
                    case 1:\
                        SET_TILE_MODE(T, M2d);\
                        break;\
                    case 2:\
                        SET_TILE_MODE(T, M2d_2x);\
                        break;\
                    case 4:\
                        SET_TILE_MODE(T, M2d_4x);\
                        break;\
                    case 8:\
                        SET_TILE_MODE(T, M2d_8x);\
                        break;\
                    case 16:\
                        SET_TILE_MODE(T, M2d_16x);\
                        break;\
                    default:\
                        __GMM_ASSERT(0);\
                    }\
                    break;\
                case RESOURCE_3D:\
                    SET_TILE_MODE(T, M3d);\
                    break;\
                default:\
                    __GMM_ASSERT(0);\
            }\
        }


        // clang-format on
        if(pTexInfo->Flags.Info.TiledYf)
        {
            GENERATE_TILE_MODE(YF, 1D, 2D, 2D_2X, 2D_4X, 2D_8X, 2D_16X, 3D);

            pTexInfo->Flags.Info.TiledYf = 1;
            pTexInfo->Flags.Info.TiledYs = 0;
        }
        else
        {
            if(pGmmLibContext->GetSkuTable().FtrTileY)
            {
                GENERATE_TILE_MODE(YS, 1D, 2D, 2D_2X, 2D_4X, 2D_8X, 2D_16X, 3D);
            }
            else
            {
                if (pGmmLibContext->GetSkuTable().FtrXe2PlusTiling)
                {
                    GENERATE_TILE_MODE(_64, 1D, 2D, 2D_2X, 2D_4X, 2D_8X, 2D_16X, 3D);
                }
                else
                {
                    GENERATE_TILE_MODE(_64, 1D, 2D, 2D_2X, 2D_4X, 2D_4X, 2D_4X, 3D);
                }
            }

            pTexInfo->Flags.Info.TiledYf = 0;
            GMM_SET_64KB_TILE(pTexInfo->Flags, 1, pGmmLibContext);
        }


        GMM_SET_4KB_TILE(pTexInfo->Flags, pGmmLibContext->GetSkuTable().FtrTileY ? 1 : 0, pGmmLibContext);

        pTexInfo->Flags.Info.TiledX = 0;
        pTexInfo->Flags.Info.TiledW = 0;
        pTexInfo->Flags.Info.Linear = 0;
#undef SET_TILE_MODE
    }
    else if(GMM_IS_4KB_TILE(pTexInfo->Flags))
    {
        GMM_SET_4KB_TILE(pTexInfo->Flags, 1, pGmmLibContext);
        pTexInfo->Flags.Info.TiledYf = 0;
        pTexInfo->Flags.Info.TiledYs = 0;
        pTexInfo->Flags.Info.TiledX  = 0;
        pTexInfo->Flags.Info.TiledW  = 0;
        pTexInfo->Flags.Info.Linear  = 0;
        GMM_SET_4KB_TILE_MODE(pTexInfo->TileMode, pGmmLibContext);
    }
    else if(pTexInfo->Flags.Info.TiledX)
    {
        pTexInfo->Flags.Info.TiledY  = 0;
        pTexInfo->Flags.Info.TiledYf = 0;
        pTexInfo->Flags.Info.TiledYs = 0;
        pTexInfo->Flags.Info.TiledX  = 1;
        pTexInfo->Flags.Info.TiledW  = 0;
        pTexInfo->Flags.Info.Linear  = 0;
        pTexInfo->TileMode           = LEGACY_TILE_X;
    }
    else if(pTexInfo->Flags.Info.TiledW)
    {
        pTexInfo->Flags.Info.TiledY  = 0;
        pTexInfo->Flags.Info.TiledYf = 0;
        pTexInfo->Flags.Info.TiledYs = 0;
        pTexInfo->Flags.Info.TiledX  = 0;
        pTexInfo->Flags.Info.TiledW  = 1;
        pTexInfo->Flags.Info.Linear  = 0;
        pTexInfo->TileMode           = LEGACY_TILE_Y;
    }
    else if(pTexInfo->Flags.Info.Linear)
    {
        pTexInfo->Flags.Info.TiledY  = 0;
        pTexInfo->Flags.Info.TiledYf = 0;
        pTexInfo->Flags.Info.TiledYs = 0;
        pTexInfo->Flags.Info.TiledX  = 0;
        pTexInfo->Flags.Info.TiledW  = 0;
        pTexInfo->Flags.Info.Linear  = 1;
        pTexInfo->TileMode           = TILE_NONE;
    }
    else
    {
        GMM_ASSERTDPF(0, "No tiling preference set!");
    }
    
    GMM_ASSERTDPF(pTexInfo->TileMode < GMM_TILE_MODES, "Invalid Tile Mode Set");
}